

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
EnrichableI2cAnalyzerSettings::LoadSettings(EnrichableI2cAnalyzerSettings *this,char *settings)

{
  int iVar1;
  SimpleArchive text_archive;
  char *name_string;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&name_string);
  iVar1 = strcmp(name_string,"SaleaeEnrichableI2CAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeEnrichableI2CAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(&text_archive,&this->mSdaChannel);
  SimpleArchive::operator>>(&text_archive,&this->mSclChannel);
  SimpleArchive::operator>>(&text_archive,&this->mAddressDisplay);
  SimpleArchive::operator>>(&text_archive,&this->mParserCommand);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSdaChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void EnrichableI2cAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	const char* name_string;	//the first thing in the archive is the name of the protocol analyzer that the data belongs to.
	text_archive >> &name_string;
	if( strcmp( name_string, "SaleaeEnrichableI2CAnalyzer" ) != 0 )
		AnalyzerHelpers::Assert( "SaleaeEnrichableI2CAnalyzer: Provided with a settings string that doesn't belong to us;" );

	text_archive >> mSdaChannel;
	text_archive >> mSclChannel;
	text_archive >> *(U32*)&mAddressDisplay;
	text_archive >>  &mParserCommand;

	ClearChannels();
	AddChannel( mSdaChannel, "SDA", true );
	AddChannel( mSclChannel, "SCL", true );

	UpdateInterfacesFromSettings();
}